

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipe.cpp
# Opt level: O2

int __thiscall blc::tools::pipe::pipe(pipe *this,int *__pipedes)

{
  mutex *pmVar1;
  int extraout_EAX;
  __shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2> local_20;
  
  (this->super_stream)._vptr_stream = (_func_int **)&PTR_write_0011aac8;
  (this->_closed).super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->_closed).super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this->_out = *(string **)(__pipedes + 6);
  pmVar1 = *(mutex **)(__pipedes + 4);
  this->_in = *(string **)(__pipedes + 2);
  this->_inMut = pmVar1;
  this->_outMut = *(mutex **)(__pipedes + 8);
  this->_master = SUB41(__pipedes[10],0);
  this->_block = *(bool *)((long)__pipedes + 0x29);
  std::__shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_20,(__shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2> *)(__pipedes + 0xc));
  std::__shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->_closed).super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>,&local_20);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_20._M_refcount);
  return extraout_EAX;
}

Assistant:

blc::tools::pipe::pipe(const pipe &other) {
	this->_in = const_cast<blc::tools::pipe &>(other).getIn();
	this->_out = const_cast<blc::tools::pipe &>(other).getOut();
	this->_inMut = const_cast<blc::tools::pipe &>(other).getInMut();
	this->_outMut = const_cast<blc::tools::pipe &>(other).getOutMut();
	this->_master = const_cast<blc::tools::pipe &>(other).getState();
	this->_block = const_cast<blc::tools::pipe &>(other).getBlock();
	this->_closed = const_cast<blc::tools::pipe &>(other).getClosed();
}